

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputGetVector(HelicsInput inp,double *data,int maxlen,int *actualSize,HelicsError *err)

{
  int iVar1;
  InputObject *pIVar2;
  Input *in_RCX;
  int in_EDX;
  long in_RSI;
  double *in_R8;
  int length;
  InputObject *inpObj;
  HelicsError *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  pIVar2 = anon_unknown.dwarf_5d1c2::verifyInput
                     ((HelicsInput)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc0);
  if (in_RCX != (Input *)0x0) {
    *(undefined4 *)&(in_RCX->super_Interface)._vptr_Interface = 0;
  }
  if (pIVar2 != (InputObject *)0x0) {
    if ((in_RSI == 0) || (in_EDX < 1)) {
      helics::Input::clearUpdate((Input *)0x1cfada);
    }
    else {
      iVar1 = helics::Input::getValue(in_RCX,in_R8,(int)((ulong)pIVar2 >> 0x20));
      if (in_RCX != (Input *)0x0) {
        *(int *)&(in_RCX->super_Interface)._vptr_Interface = iVar1;
      }
    }
  }
  return;
}

Assistant:

void helicsInputGetVector(HelicsInput inp, double data[], int maxlen, int* actualSize, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (actualSize != nullptr) {
        *actualSize = 0;
    }
    if (inpObj == nullptr) {
        return;
    }
    if ((data == nullptr) || (maxlen <= 0)) {
        inpObj->inputPtr->clearUpdate();
        // this isn't an error, just no data retrieved
        return;
    }
    try {
        const int length = inpObj->inputPtr->getValue(data, maxlen);
        if (actualSize != nullptr) {
            *actualSize = length;
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}